

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nni_file_walk(char *name,nni_file_walker walker,void *arg,int flags)

{
  int iVar1;
  uint local_3c;
  nni_file_walker p_Stack_38;
  int wflags;
  walkdata w;
  int flags_local;
  void *arg_local;
  nni_file_walker walker_local;
  char *name_local;
  
  local_3c = 0;
  if ((flags & 4U) != 0) {
    local_3c = 4;
  }
  if ((flags & 2U) != 0) {
    local_3c = local_3c | 2;
  }
  p_Stack_38 = walker;
  w.fn = (nni_file_walker)arg;
  w.arg._4_4_ = flags;
  iVar1 = nni_plat_file_walk(name,plat_walker,&stack0xffffffffffffffc8,local_3c);
  return iVar1;
}

Assistant:

int
nni_file_walk(const char *name, nni_file_walker walker, void *arg, int flags)
{
	struct walkdata w;
	int             wflags = 0;

	w.fn  = walker;
	w.arg = arg;

	if (flags & NNI_FILE_WALK_FILES_ONLY) {
		wflags |= NNI_PLAT_FILE_WALK_FILES_ONLY;
	}
	if (flags & NNI_FILE_WALK_SHALLOW) {
		wflags |= NNI_PLAT_FILE_WALK_SHALLOW;
	}

	return (nni_plat_file_walk(name, plat_walker, &w, wflags));
}